

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventloop.cpp
# Opt level: O2

void __thiscall
QEventLoop::processEvents(QEventLoop *this,ProcessEventsFlags flags,QDeadlineTimer deadline)

{
  bool bVar1;
  long in_FS_OFFSET;
  QDeadlineTimer local_30;
  long local_20;
  
  local_30._8_8_ = deadline._8_8_;
  local_30.t1 = deadline.t1;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->super_QObject).d_ptr.d[1].q_ptr[6]._vptr_QObject != (_func_int **)0x0) {
    do {
      bVar1 = processEvents(this,(ProcessEventsFlags)
                                 ((uint)flags.
                                        super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
                                        super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i &
                                 0xfffffffb));
      if (!bVar1) break;
      bVar1 = QDeadlineTimer::hasExpired(&local_30);
    } while (!bVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEventLoop::processEvents(ProcessEventsFlags flags, QDeadlineTimer deadline)
{
    Q_D(QEventLoop);
    if (!d->threadData.loadRelaxed()->hasEventDispatcher())
        return;

    while (processEvents(flags & ~WaitForMoreEvents)) {
        if (deadline.hasExpired())
            break;
    }
}